

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

char * pm_slashskip(char *s)

{
  bool bVar1;
  char *local_10;
  char *s_local;
  
  local_10 = s;
  while( true ) {
    bVar1 = true;
    if ((*local_10 != '/') &&
       (((*local_10 != '.' || (bVar1 = true, local_10[1] != '/')) &&
        (bVar1 = false, *local_10 == '.')))) {
      bVar1 = local_10[1] == '\0';
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static const char *
pm_slashskip(const char *s) {
	while ((*s == '/')
	    || (s[0] == '.' && s[1] == '/')
	    || (s[0] == '.' && s[1] == '\0'))
		++s;
	return (s);
}